

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeEndTransaction(Btree *p)

{
  sqlite3 *psVar1;
  BtShared *pBt;
  BtLock *pBVar2;
  int iVar3;
  ushort uVar4;
  BtLock **ppBVar5;
  
  psVar1 = p->db;
  pBt = p->pBt;
  pBt->bDoTruncate = '\0';
  if (p->inTrans == '\0') goto LAB_00121ad8;
  if (1 < psVar1->nVdbeRead) {
    if (pBt->pWriter == p) {
      pBt->pWriter = (Btree *)0x0;
      *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0x3f;
      ppBVar5 = &pBt->pLock;
      while (pBVar2 = *ppBVar5, pBVar2 != (BtLock *)0x0) {
        pBVar2->eLock = '\x01';
        ppBVar5 = &pBVar2->pNext;
      }
    }
    p->inTrans = '\x01';
    return;
  }
  ppBVar5 = &pBt->pLock;
  while (pBVar2 = *ppBVar5, pBVar2 != (BtLock *)0x0) {
    if (pBVar2->pBtree == p) {
      *ppBVar5 = pBVar2->pNext;
      if (pBVar2->iTable != 1) {
        sqlite3_free(pBVar2);
      }
    }
    else {
      ppBVar5 = &pBVar2->pNext;
    }
  }
  if (pBt->pWriter == p) {
    pBt->pWriter = (Btree *)0x0;
    iVar3 = pBt->nTransaction;
    uVar4 = 0xff3f;
LAB_00121ac6:
    pBt->btsFlags = pBt->btsFlags & uVar4;
  }
  else {
    iVar3 = pBt->nTransaction;
    if (iVar3 == 2) {
      uVar4 = 0xff7f;
      iVar3 = 2;
      goto LAB_00121ac6;
    }
  }
  pBt->nTransaction = iVar3 + -1;
  if (iVar3 + -1 == 0) {
    pBt->inTransaction = '\0';
  }
LAB_00121ad8:
  p->inTrans = '\0';
  unlockBtreeIfUnused(pBt);
  return;
}

Assistant:

static void btreeEndTransaction(Btree *p){
  BtShared *pBt = p->pBt;
  sqlite3 *db = p->db;
  assert( sqlite3BtreeHoldsMutex(p) );

#ifndef SQLITE_OMIT_AUTOVACUUM
  pBt->bDoTruncate = 0;
#endif
  if( p->inTrans>TRANS_NONE && db->nVdbeRead>1 ){
    /* If there are other active statements that belong to this database
    ** handle, downgrade to a read-only transaction. The other statements
    ** may still be reading from the database.  */
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = TRANS_READ;
  }else{
    /* If the handle had any kind of transaction open, decrement the 
    ** transaction count of the shared btree. If the transaction count 
    ** reaches 0, set the shared state to TRANS_NONE. The unlockBtreeIfUnused()
    ** call below will unlock the pager.  */
    if( p->inTrans!=TRANS_NONE ){
      clearAllSharedCacheTableLocks(p);
      pBt->nTransaction--;
      if( 0==pBt->nTransaction ){
        pBt->inTransaction = TRANS_NONE;
      }
    }

    /* Set the current transaction state to TRANS_NONE and unlock the 
    ** pager if this call closed the only read or write transaction.  */
    p->inTrans = TRANS_NONE;
    unlockBtreeIfUnused(pBt);
  }

  btreeIntegrity(p);
}